

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser_bindings.cpp
# Opt level: O3

PyObject * PyInit_pytourn(void)

{
  handle hVar1;
  handle hVar2;
  int iVar3;
  char *__s1;
  long *plVar4;
  module_ m;
  cpp_function func;
  handle local_60;
  handle local_58;
  handle local_50;
  object local_48;
  accessor<pybind11::detail::accessor_policies::str_attr> local_40;
  
  __s1 = (char *)Py_GetVersion();
  iVar3 = strncmp(__s1,"3.10",4);
  if ((iVar3 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              ((module_ *)&local_60,"pytourn",(char *)0x0,&pybind11_module_def_pytourn);
    local_40.obj.m_ptr = local_60.m_ptr;
    local_40.key = "__doc__";
    local_40.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_40,(char (*) [30])"Python interface for tournser");
    pybind11::object::~object(&local_40.cache);
    hVar1.m_ptr = local_60.m_ptr;
    local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    plVar4 = (long *)__tls_get_addr(&PTR_0013fe00);
    *plVar4 = *plVar4 + 1;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_50.m_ptr = (PyObject *)PyObject_GetAttrString(hVar1.m_ptr,"run_tournser");
    if (local_50.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      *plVar4 = *plVar4 + 1;
      local_50.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    hVar2.m_ptr = local_50.m_ptr;
    local_58.m_ptr = (PyObject *)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
    ((PyObject *)(local_40._0_8_ + 0x30))->ob_refcnt =
         (Py_ssize_t)
         pybind11::cpp_function::
         initialize<pybind11_init_pytourn(pybind11::module_&)::$_0,pybind11::dict,std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pytourn(pybind11::module_&)::$_0&&,pybind11::dict(*)(std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(undefined2 *)(local_40._0_8_ + 0x5c) = 8;
    *(byte *)(local_40._0_8_ + 0x59) = *(byte *)(local_40._0_8_ + 0x59) & 0x9f;
    *(char **)local_40._0_8_ = "run_tournser";
    *(PyObject **)(local_40._0_8_ + 0x68) = hVar1.m_ptr;
    ((PyObject *)(local_40._0_8_ + 0x70))->ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_58,(unique_function_record *)&local_40,
               "({List[int]}, {List[List[float]]}, {str}, {bool}, {int}, {bool}, {bool}, {str}) -> %"
               ,(type_info **)
                pybind11::cpp_function::
                initialize<pybind11_init_pytourn(pybind11::module_&)::$_0,pybind11::dict,std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pytourn(pybind11::module_&)::$_0&&,pybind11::dict(*)(std::vector<int,std::allocator<int>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,char*,bool,unsigned_int,bool,bool,char*),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
                ::types,8);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_40);
    pybind11::object::~object((object *)&local_50);
    pybind11::object::~object(&local_48);
    pybind11::module_::add_object((module_ *)&local_60,"run_tournser",local_58,true);
    pybind11::object::~object((object *)&local_58);
    pybind11::object::~object((object *)&local_60);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_60.m_ptr = (PyObject *)0x0;
  }
  return local_60.m_ptr;
}

Assistant:

PYBIND11_MODULE(pytourn, m) {

  m.doc() = "Python interface for tournser";

  m.def("run_tournser", [](std::vector<int>& vertices, std::vector<std::vector<value_t>>& edges,
                                char* filter, bool approx, uint32_t approx_val,
                                bool count_only, bool in_file, char* filename) {

    // Save std::cout status and disable
    auto cout_buff = std::cout.rdbuf();
    std::cout.rdbuf(nullptr);

    std::vector<size_t> cell_counts;
    py::dict output;
    delta_complex_t complex = delta_complex_t();

    //initialise approximate functionality
    size_t max_entries = std::numeric_limits<size_t>::max();
    if (approx) max_entries = approx_val;

    bool dist = false;
    if(in_file){
        complex = read_graph(filename,filter,dist);
    } else{
        complex = read_graph(vertices,edges,filter,dist);
    }
    complex.compute_oldest_cofaces();



    for(int i = 0; i < complex.cells.size(); i++){
        cell_counts.push_back(complex.cells[i].size());
    }
    
    output["cell_counts"] = cell_counts;

    //create tournser object and compute persistent homology
    if (!count_only){
        tournser thetournser = tournser(&complex,filename,max_entries,true);
        thetournser.compute_barcodes();
        output["finite_pairs"] = thetournser.finite_pairs;
        output["infinite_pairs"] = thetournser.infinite_pairs;
        output["bettis"] = thetournser.num_infinite_pairs();
    }
    
 // Re-enable again cout
    std::cout.rdbuf(cout_buff);

    return output;
  });
}